

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupCycled(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  int *pInitState;
  uint *__ptr;
  void *pvVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  int iVar8;
  ulong __size;
  int iVar9;
  
  Gia_ManCleanMark0(p);
  Gia_ManCycle(p,pCex,nFrames);
  iVar8 = ((p->nRegs >> 5) + 1) - (uint)((p->nRegs & 0x1fU) == 0);
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  *__ptr = iVar8 * 0x20;
  if (iVar8 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)iVar8 << 2);
  }
  *(void **)(__ptr + 2) = pvVar5;
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    iVar9 = 0;
    do {
      iVar2 = p->vCis->nSize;
      uVar7 = (iVar2 - iVar8) + iVar9;
      if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = p->vCis->pArray[uVar7];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(undefined8 *)(p->pObjs + iVar8);
      uVar7 = *__ptr;
      uVar3 = __ptr[1];
      if (uVar3 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(4);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),4);
          }
          *(void **)(__ptr + 2) = pvVar5;
          uVar7 = 0x20;
          if (pvVar5 == (void *)0x0) {
LAB_001d967f:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
          }
        }
        else {
          if (SBORROW4(uVar7,uVar7 * 2) == 0 < (int)uVar7) goto LAB_001d95b1;
          iVar8 = ((uVar7 >> 4) + 1) - (uint)((uVar7 & 0xf) == 0);
          __size = (ulong)(uint)(iVar8 * 4);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(__size);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),__size);
          }
          *(void **)(__ptr + 2) = pvVar5;
          if (pvVar5 == (void *)0x0) goto LAB_001d967f;
          uVar7 = iVar8 * 0x20;
        }
        *__ptr = uVar7;
      }
LAB_001d95b1:
      uVar7 = 1 << ((byte)uVar3 & 0x1f);
      if (((uint)uVar4 >> 0x1e & 1) == 0) {
        puVar1 = (uint *)(*(long *)(__ptr + 2) + (long)((int)uVar3 >> 5) * 4);
        *puVar1 = *puVar1 & ~uVar7;
      }
      else {
        puVar1 = (uint *)(*(long *)(__ptr + 2) + (long)((int)uVar3 >> 5) * 4);
        *puVar1 = *puVar1 | uVar7;
      }
      __ptr[1] = uVar3 + 1;
      iVar9 = iVar9 + 1;
      iVar8 = p->nRegs;
    } while (iVar9 < iVar8);
  }
  pInitState = *(int **)(__ptr + 2);
  pGVar6 = Gia_ManDupFlip(p,pInitState);
  if (pInitState != (int *)0x0) {
    free(pInitState);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  Gia_ManCleanMark0(p);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupCycled( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Man_t * pNew;
    Vec_Bit_t * vInits;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0(p);
    Gia_ManCycle( p, pCex, nFrames );
    vInits = Vec_BitAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        Vec_BitPush( vInits, pObj->fMark0 );
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInits) );
    Vec_BitFree( vInits );
    Gia_ManCleanMark0(p);
    return pNew;
}